

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.cpp
# Opt level: O2

bool __thiscall common_arg::get_value_from_env(common_arg *this,string *output)

{
  char *pcVar1;
  
  if (this->env == (char *)0x0) {
    return false;
  }
  pcVar1 = getenv(this->env);
  if (pcVar1 != (char *)0x0) {
    std::__cxx11::string::assign((char *)output);
  }
  return pcVar1 != (char *)0x0;
}

Assistant:

bool common_arg::get_value_from_env(std::string & output) {
    if (env == nullptr) return false;
    char * value = std::getenv(env);
    if (value) {
        output = value;
        return true;
    }
    return false;
}